

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QProcessEnvironmentPrivate>::detach
          (QSharedDataPointer<QProcessEnvironmentPrivate> *this)

{
  bool bVar1;
  int iVar2;
  QProcessEnvironmentPrivate *this_00;
  totally_ordered_wrapper<QProcessEnvironmentPrivate_*> *in_RDI;
  QProcessEnvironmentPrivate *x;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff90;
  QProcessEnvironmentPrivate *local_60;
  QProcessEnvironmentPrivate *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  QProcessEnvironmentPrivate *in_stack_ffffffffffffffc8;
  
  bVar1 = Qt::totally_ordered_wrapper::operator_cast_to_bool
                    ((totally_ordered_wrapper<QProcessEnvironmentPrivate_*> *)0x79461c);
  if (bVar1) {
    Qt::totally_ordered_wrapper<QProcessEnvironmentPrivate_*>::operator->
              ((totally_ordered_wrapper<QProcessEnvironmentPrivate_*> *)0x79462c);
    iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x794634);
    if (iVar2 == 1) {
      return;
    }
  }
  bVar1 = Qt::totally_ordered_wrapper::operator_cast_to_bool
                    ((totally_ordered_wrapper<QProcessEnvironmentPrivate_*> *)0x794648);
  uVar3 = 0;
  if (bVar1) {
    local_60 = (QProcessEnvironmentPrivate *)operator_new(0x20);
    Qt::totally_ordered_wrapper<QProcessEnvironmentPrivate_*>::
    operator*<QProcessEnvironmentPrivate,_true>
              ((totally_ordered_wrapper<QProcessEnvironmentPrivate_*> *)0x794683);
    QProcessEnvironmentPrivate::QProcessEnvironmentPrivate
              (in_stack_ffffffffffffffc8,
               (QProcessEnvironmentPrivate *)CONCAT17(uVar3,in_stack_ffffffffffffffc0));
  }
  else {
    local_60 = (QProcessEnvironmentPrivate *)operator_new(0x20);
    QProcessEnvironmentPrivate::QProcessEnvironmentPrivate(in_stack_ffffffffffffffb0);
  }
  QBasicAtomicInteger<int>::ref(in_stack_ffffffffffffff90);
  bVar1 = Qt::totally_ordered_wrapper::operator_cast_to_bool
                    ((totally_ordered_wrapper<QProcessEnvironmentPrivate_*> *)0x7946ee);
  if (bVar1) {
    Qt::totally_ordered_wrapper<QProcessEnvironmentPrivate_*>::operator->
              ((totally_ordered_wrapper<QProcessEnvironmentPrivate_*> *)0x794701);
    bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x794709);
    if ((!bVar1) &&
       (this_00 = Qt::totally_ordered_wrapper<QProcessEnvironmentPrivate_*>::get(in_RDI),
       this_00 != (QProcessEnvironmentPrivate *)0x0)) {
      QProcessEnvironmentPrivate::~QProcessEnvironmentPrivate(this_00);
      operator_delete(this_00,0x20);
    }
  }
  Qt::totally_ordered_wrapper<QProcessEnvironmentPrivate_*>::reset(in_RDI,local_60);
  return;
}

Assistant:

Q_INLINE_TEMPLATE void QSharedDataPointer<QProcessEnvironmentPrivate>::detach()
{
    if (d && d->ref.loadRelaxed() == 1)
        return;
    QProcessEnvironmentPrivate *x = (d ? new QProcessEnvironmentPrivate(*d)
                                     : new QProcessEnvironmentPrivate);
    x->ref.ref();
    if (d && !d->ref.deref())
        delete d.get();
    d.reset(x);
}